

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_RTree * __thiscall ON_SubDMeshImpl::FragmentTree(ON_SubDMeshImpl *this)

{
  ON_SubDMeshFragment *this_00;
  uint uVar1;
  ON_RTree *this_01;
  ON_SubDMeshFragment **ppOVar2;
  
  this_01 = this->m_fragment_tree;
  if (this_01 == (ON_RTree *)0x0) {
    this_01 = (ON_RTree *)0x0;
  }
  else if (this->m_first_fragment != (ON_SubDMeshFragment *)0x0) {
    this_01 = (ON_RTree *)operator_new(0x48);
    ON_RTree::ON_RTree(this_01,0);
    ppOVar2 = &this->m_first_fragment;
    while (this_00 = *ppOVar2, this_00 != (ON_SubDMeshFragment *)0x0) {
      uVar1 = ON_SubDMeshFragment::PointCount(this_00);
      if (uVar1 != 0) {
        ON_RTree::Insert(this_01,(double *)&this_00->m_surface_bbox,
                         &(this_00->m_surface_bbox).m_max.x,this_00);
      }
      ppOVar2 = &this_00->m_next_fragment;
    }
    this->m_fragment_tree = this_01;
  }
  if (this_01 == (ON_RTree *)0x0) {
    this_01 = &ON_RTree::Empty;
  }
  return this_01;
}

Assistant:

const ON_RTree& ON_SubDMeshImpl::FragmentTree() const
{
  if (nullptr != m_fragment_tree && nullptr != m_first_fragment)
  {
    ON_RTree* fragment_tree = new ON_RTree();
    for (const ON_SubDMeshFragment* fragment = m_first_fragment; nullptr != fragment; fragment = fragment->m_next_fragment)
    {
      if (fragment->PointCount() > 0 )
        fragment_tree->Insert(&(fragment->m_surface_bbox.m_min.x), &(fragment->m_surface_bbox.m_max.x), (void*)fragment);
    }
    const_cast< ON_SubDMeshImpl* >(this)->m_fragment_tree = fragment_tree;
  }
  return (nullptr == m_fragment_tree ) ? ON_RTree::Empty : *m_fragment_tree;
}